

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leb128.cc
# Opt level: O1

void wabt::WriteS64Leb128(Stream *stream,uint64_t value,char *desc)

{
  size_t sVar1;
  size_t size;
  byte bVar2;
  bool bVar3;
  uint8_t data [10];
  byte local_a [10];
  
  if ((long)value < 0) {
    size = 0;
    do {
      bVar3 = (value & 0x40) == 0 || (long)value >> 7 != 0xffffffffffffffff;
      local_a[size] = bVar3 << 7 | (byte)value & 0x7f;
      size = size + 1;
      value = (long)value >> 7;
    } while (bVar3);
  }
  else {
    sVar1 = 0;
    do {
      bVar2 = (byte)value | 0x80;
      if (value < 0x40) {
        bVar2 = (byte)value;
      }
      size = sVar1 + 1;
      local_a[sVar1] = bVar2;
      bVar3 = 0x3f < value;
      sVar1 = size;
      value = value >> 7;
    } while (bVar3);
  }
  Stream::WriteData(stream,local_a,size,desc,No);
  return;
}

Assistant:

void WriteS64Leb128(Stream* stream, uint64_t value, const char* desc) {
  WriteS64Leb128(stream, Bitcast<int64_t>(value), desc);
}